

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O0

DisasJumpType op_vfa(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t aofs;
  uint32_t bofs;
  bool bVar5;
  code *local_38;
  undefined1 *fn;
  _Bool se;
  uint8_t m5;
  uint8_t fpf;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = get_field1(s,FLD_O_m4,FLD_C_b4);
  uVar2 = get_field1(s,FLD_O_m5,FLD_C_d1);
  uVar3 = extract32(uVar2 & 0xff,3,1);
  bVar5 = uVar3 != 0;
  if (((char)iVar1 == '\x03') && (uVar3 = extract32(uVar2 & 0xff,0,3), uVar3 == 0)) {
    uVar4 = (uint)(byte)(s->fields).field_0x9;
    uVar2 = uVar4 - 0xe2;
    if (4 < uVar2 && uVar4 != 0xe7) {
LAB_01274952:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate_vx.inc.c"
                 ,0xa40,(char *)0x0);
    }
    switch((long)&switchD_012748d6::switchdataD_013c9c20 +
           (long)(int)(&switchD_012748d6::switchdataD_013c9c20)[uVar2]) {
    case 0x12748d8:
      local_38 = gen_helper_gvec_vfa64;
      if (bVar5) {
        local_38 = gen_helper_gvec_vfa64s;
      }
      break;
    case 0x12748f6:
      local_38 = gen_helper_gvec_vfd64;
      if (bVar5) {
        local_38 = gen_helper_gvec_vfd64s;
      }
      break;
    case 0x1274914:
      local_38 = gen_helper_gvec_vfm64;
      if (bVar5) {
        local_38 = gen_helper_gvec_vfm64s;
      }
      break;
    case 0x1274932:
      local_38 = gen_helper_gvec_vfs64;
      if (bVar5) {
        local_38 = gen_helper_gvec_vfs64s;
      }
      break;
    case 0x1274950:
      goto LAB_01274952;
    }
    iVar1 = get_field1(s,FLD_O_v1,FLD_C_b1);
    uVar3 = vec_full_reg_offset((uint8_t)iVar1);
    iVar1 = get_field1(s,FLD_O_v2,FLD_C_d4);
    aofs = vec_full_reg_offset((uint8_t)iVar1);
    iVar1 = get_field1(s,FLD_O_v3,FLD_C_i3);
    bofs = vec_full_reg_offset((uint8_t)iVar1);
    tcg_gen_gvec_3_ptr_s390x(tcg_ctx_00,uVar3,aofs,bofs,tcg_ctx_00->cpu_env,0x10,0x10,0,local_38);
    s_local._4_4_ = DISAS_NEXT;
  }
  else {
    gen_program_exception(s,6);
    s_local._4_4_ = DISAS_NORETURN;
  }
  return s_local._4_4_;
}

Assistant:

static DisasJumpType op_vfa(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t fpf = get_field(s, m4);
    const uint8_t m5 = get_field(s, m5);
    const bool se = extract32(m5, 3, 1);
    gen_helper_gvec_3_ptr *fn;

    if (fpf != FPF_LONG || extract32(m5, 0, 3)) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    switch (s->fields.op2) {
    case 0xe3:
        fn = se ? gen_helper_gvec_vfa64s : gen_helper_gvec_vfa64;
        break;
    case 0xe5:
        fn = se ? gen_helper_gvec_vfd64s : gen_helper_gvec_vfd64;
        break;
    case 0xe7:
        fn = se ? gen_helper_gvec_vfm64s : gen_helper_gvec_vfm64;
        break;
    case 0xe2:
        fn = se ? gen_helper_gvec_vfs64s : gen_helper_gvec_vfs64;
        break;
    default:
        g_assert_not_reached();
    }
    gen_gvec_3_ptr(tcg_ctx, get_field(s, v1), get_field(s, v2),
                   get_field(s, v3), tcg_ctx->cpu_env, 0, fn);
    return DISAS_NEXT;
}